

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fssimplewindow.cpp
# Opt level: O0

void FsOpenWindow(FsOpenWindowOption *opt)

{
  bool bVar1;
  int goalX;
  int goalY;
  int iVar2;
  int iVar3;
  int iVar4;
  char *local_160;
  undefined8 local_158;
  GLfloat shininess [4];
  GLfloat spc [4];
  GLfloat amb [4];
  GLfloat dif [4];
  undefined8 local_110;
  XWMHints wmHints;
  int tryAlternativeSingleBuffer;
  int sizY;
  int sizX;
  int lupY;
  int lupX;
  Font font;
  XSetWindowAttributes swa;
  char *def;
  char **m;
  int n;
  char *title;
  int useDoubleBuffer;
  int hei;
  int wid;
  int y0;
  int x0;
  FsOpenWindowOption *opt_local;
  
  goalX = opt->x0;
  goalY = opt->y0;
  iVar2 = opt->wid;
  iVar3 = opt->hei;
  bVar1 = opt->useDoubleBuffer;
  if (opt->windowTitle == (char *)0x0) {
    local_160 = "Main Window";
  }
  else {
    local_160 = opt->windowTitle;
  }
  FsXCreateKeyMapping();
  for (m._4_4_ = 0; m._4_4_ < 0x65; m._4_4_ = m._4_4_ + 1) {
    fsKeyPress[m._4_4_] = 0;
  }
  ysXDsp = (Display *)XOpenDisplay(0);
  if (ysXDsp == (Display *)0x0) {
    fprintf(_stderr,"Cannot Open Display.\n");
    exit(1);
  }
  printf("Opened display.\n");
  iVar4 = glXQueryExtension(ysXDsp,0);
  if (iVar4 == 0) {
    fprintf(_stderr,"This system doesn\'t support OpenGL.\n");
    exit(1);
  }
  printf("Acquired GLX extension.\n");
  wmHints.window_group._4_4_ = 0;
  if ((bVar1 & 1U) == 0) {
    ysXVis = (XVisualInfo *)glXChooseVisual(ysXDsp,*(undefined4 *)(ysXDsp + 0xe0),ysGlxCfgSingle);
    if (ysXVis == (XVisualInfo *)0x0) {
      ysXVis = (XVisualInfo *)glXChooseVisual(ysXDsp,*(undefined4 *)(ysXDsp + 0xe0),ysGlxCfgDouble);
      wmHints.window_group._4_4_ = 1;
    }
  }
  else {
    ysXVis = (XVisualInfo *)glXChooseVisual(ysXDsp,*(undefined4 *)(ysXDsp + 0xe0),ysGlxCfgDouble);
  }
  printf("Chose visual.\n");
  if (ysXVis == (XVisualInfo *)0x0) {
    fprintf(_stderr,"Double buffer not supported?\n");
    exit(1);
  }
  ysXCMap = XCreateColormap(ysXDsp,*(undefined8 *)
                                    (*(long *)(ysXDsp + 0xe8) + (long)ysXVis->screen * 0x80 + 0x10),
                            ysXVis->visual,0);
  printf("Created colormap.\n");
  ysGlRC = (GLXContext)glXCreateContext(ysXDsp,ysXVis,0,1);
  if (ysGlRC == (GLXContext)0x0) {
    fprintf(_stderr,"Cannot create OpenGL context.\n");
    exit(1);
  }
  printf("Created OpenGL context.\n");
  swa._88_8_ = ysXCMap;
  swa.border_pixmap = 0;
  swa.save_under = 0x2804f;
  swa._68_4_ = 0;
  ysXWnd = XCreateWindow(ysXDsp,*(undefined8 *)
                                 (*(long *)(ysXDsp + 0xe8) + (long)ysXVis->screen * 0x80 + 0x10),
                         goalX,goalY,iVar2,iVar3,1,ysXVis->depth,1,ysXVis->visual,0x2808,&font);
  printf("Created Window.\n");
  ysXWid = iVar2;
  ysXHei = iVar3;
  ysXlupX = goalX;
  ysXlupY = goalY;
  XStoreName(ysXDsp,ysXWnd,local_160);
  local_110 = 0;
  wmHints.flags._4_4_ = 1;
  XSetWMHints(ysXDsp,ysXWnd,&local_110);
  XSetIconName(ysXDsp,ysXWnd,local_160);
  XMapWindow(ysXDsp,ysXWnd);
  ForceMoveWindow(ysXDsp,&ysXWnd,goalX,goalY);
  ysXlupX = goalX;
  ysXlupY = goalY;
  printf("Zzz...\n");
  sleep(1);
  printf("Slept one second.\n");
  glXMakeCurrent(ysXDsp,ysXWnd,ysGlRC);
  glClearColor(0x3f800000,0x3f800000,0x3f800000,0);
  glClear(0x4100);
  glFlush();
  glEnable(0xb71);
  glDepthFunc(0x203);
  glShadeModel(0x1d01);
  amb[2] = 0.8;
  amb[3] = 0.8;
  spc[2] = 0.4;
  spc[3] = 0.4;
  amb[0] = 0.4;
  amb[1] = 1.0;
  shininess[2] = 0.9;
  shininess[3] = 0.9;
  spc[0] = 0.9;
  spc[1] = 1.0;
  local_158 = 0x4248000042480000;
  shininess[0] = 50.0;
  shininess[1] = 0.0;
  glEnable(0xb50);
  glEnable(0x4000);
  glLightfv(0x4000,0x1201,amb + 2);
  glLightfv(0x4000,0x1202,shininess + 2);
  glMaterialfv(0x405,0x1601,&local_158);
  glLightModelfv(0xb53,spc + 2);
  glEnable(0xb57);
  glEnable(0xba1);
  if (wmHints.window_group._4_4_ != 0) {
    glDrawBuffer(0x404);
  }
  glClearColor(0x3f800000,0x3f800000,0x3f800000,0);
  glClearDepth(0x3ff0000000000000);
  glDisable(0xb71);
  glViewport(0,0,iVar2,iVar3);
  glMatrixMode(0x1701);
  glLoadIdentity();
  glOrtho(0,(double)((float)iVar2 - 1.0),(double)((float)iVar3 - 1.0),0,0xbff0000000000000,
          0x3ff0000000000000);
  glMatrixMode(0x1700);
  glLoadIdentity();
  glShadeModel(0x1d00);
  glPointSize(0x3f800000);
  glClear(0x4100);
  glColor3ub(0,0);
  return;
}

Assistant:

void FsOpenWindow(const FsOpenWindowOption &opt)
{
	int x0=opt.x0;
	int y0=opt.y0;
	int wid=opt.wid;
	int hei=opt.hei;
	int useDoubleBuffer=(int)opt.useDoubleBuffer;
	// int useMultiSampleBuffer=(int)opt.useMultiSampleBuffer;
	const char *title=(NULL!=opt.windowTitle ? opt.windowTitle : "Main Window");

	int n;
	char **m,*def;
	XSetWindowAttributes swa;
	Font font;

	int lupX,lupY,sizX,sizY;
	lupX=x0;
	lupY=y0;
	sizX=wid;
	sizY=hei;

	FsXCreateKeyMapping();
	for(n=0; n<FSKEY_NUM_KEYCODE; n++)
	{
		fsKeyPress[n]=0;
	}

	ysXDsp=XOpenDisplay(NULL);

	if(ysXDsp!=NULL)
	{
		printf("Opened display.\n");
		if(glXQueryExtension(ysXDsp,NULL,NULL)!=0)
		{
			printf("Acquired GLX extension.\n");

			int tryAlternativeSingleBuffer=0;
			if(useDoubleBuffer!=0)
			{
				ysXVis=glXChooseVisual(ysXDsp,DefaultScreen(ysXDsp),ysGlxCfgDouble);
			}
			else
			{
				ysXVis=glXChooseVisual(ysXDsp,DefaultScreen(ysXDsp),ysGlxCfgSingle);
				if(NULL==ysXVis)
				{
					ysXVis=glXChooseVisual(ysXDsp,DefaultScreen(ysXDsp),ysGlxCfgDouble);
					tryAlternativeSingleBuffer=1;
				}
			}

			printf("Chose visual.\n");

			if(ysXVis!=NULL)
			{
				ysXCMap=XCreateColormap(ysXDsp,RootWindow(ysXDsp,ysXVis->screen),ysXVis->visual,AllocNone);
				printf("Created colormap.\n");

				ysGlRC=glXCreateContext(ysXDsp,ysXVis,None,GL_TRUE);
				if(ysGlRC!=NULL)
				{
					printf("Created OpenGL context.\n");

					swa.colormap=ysXCMap;
					swa.border_pixel=0;
					swa.event_mask=ysXEventMask;

					// Memo: lupX and lupY given to XCreateWindow will be ignored.
					//       Window must be moved to the desired position by XMoveWindow after XMapWindow.
					ysXWnd=XCreateWindow(ysXDsp,RootWindow(ysXDsp,ysXVis->screen),
							  lupX,lupY,sizX,sizY,
					                  1,
							  ysXVis->depth,
					                  InputOutput,
							  ysXVis->visual,
					                  CWEventMask|CWBorderPixel|CWColormap,&swa);

					printf("Created Window.\n");

					ysXWid=sizX;
					ysXHei=sizY;
					ysXlupX=lupX;
					ysXlupY=lupY;

					XStoreName(ysXDsp,ysXWnd,title);


// Should I use XSetWMProperties? titlebar problem.
					XWMHints wmHints;
					wmHints.flags=0;
					wmHints.initial_state=NormalState;
					XSetWMHints(ysXDsp,ysXWnd,&wmHints);


					XSetIconName(ysXDsp,ysXWnd,title);
					XMapWindow(ysXDsp,ysXWnd);

					// Memo: XCreateWindow probably ignore lupX and lupY.  Window must be moved here.
					ForceMoveWindow(ysXDsp,ysXWnd,lupX,lupY);
					// ForceMoveWindow may have failed to place the window, but let's at least reset lupX and lupY.
					ysXlupX=lupX;
					ysXlupY=lupY;

					printf("Zzz...\n");
					sleep(1);
					printf("Slept one second.\n");

					/* printf("Wait Expose Event\n");
					XEvent ev;
					while(XCheckTypedEvent(ysXDsp,Expose,&ev)!=True)
					  {
					    printf("Waiting for create notify\n");
					    sleep(1);
					  }
					printf("Window=%d\n",ev.xexpose.window);
					printf("Window Created\n"); */

					glXMakeCurrent(ysXDsp,ysXWnd,ysGlRC);

					// These lines are needed, or window will not appear >>
				    glClearColor(1.0F,1.0F,1.0F,0.0F);
					glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT);
					glFlush();
					// glXSwapBuffers(ysXDsp,ysXWnd);
					// These lines are needed, or window will not appear <<

					glEnable(GL_DEPTH_TEST);
					glDepthFunc(GL_LEQUAL);
					glShadeModel(GL_SMOOTH);

					GLfloat dif[]={0.8F,0.8F,0.8F,1.0F};
					GLfloat amb[]={0.4F,0.4F,0.4F,1.0F};
					GLfloat spc[]={0.9F,0.9F,0.9F,1.0F};
					GLfloat shininess[]={50.0,50.0,50.0,0.0};

					glEnable(GL_LIGHTING);
					glEnable(GL_LIGHT0);
					glLightfv(GL_LIGHT0,GL_DIFFUSE,dif);
					glLightfv(GL_LIGHT0,GL_SPECULAR,spc);
					glMaterialfv(GL_FRONT|GL_BACK,GL_SHININESS,shininess);

					glLightModelfv(GL_LIGHT_MODEL_AMBIENT,amb);
					glEnable(GL_COLOR_MATERIAL);
					glEnable(GL_NORMALIZE);

					if(0!=tryAlternativeSingleBuffer)
					{
						glDrawBuffer(GL_FRONT);
					}

				    glClearColor(1.0F,1.0F,1.0F,0.0F);
				    glClearDepth(1.0F);
					glDisable(GL_DEPTH_TEST);

					glViewport(0,0,sizX,sizY);

				    glMatrixMode(GL_PROJECTION);
					glLoadIdentity();
					glOrtho(0,(float)sizX-1,(float)sizY-1,0,-1,1);

					glMatrixMode(GL_MODELVIEW);
					glLoadIdentity();

					glShadeModel(GL_FLAT);
					glPointSize(1);
					glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT);
					glColor3ub(0,0,0);
				}
				else
				{
					fprintf(stderr,"Cannot create OpenGL context.\n");
					exit(1);
				}
			}
			else
			{
				fprintf(stderr,"Double buffer not supported?\n");
				exit(1);
			}
		}
		else
		{
			fprintf(stderr,"This system doesn't support OpenGL.\n");
			exit(1);
		}
	}
	else
	{
		fprintf(stderr,"Cannot Open Display.\n");
		exit(1);
	}

	return;
}